

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

void __thiscall
Qentem::QTest::IsNotEqual<Qentem::String<char>,char[3]>
          (QTest *this,String<char> *left,char (*right) [3],unsigned_long line)

{
  bool bVar1;
  unsigned_long line_local;
  char (*right_local) [3];
  String<char> *left_local;
  QTest *this_local;
  
  if ((((this->error_ & 1U) == 0) || ((this->continue_on_error_ & 1U) != 0)) &&
     (bVar1 = String<char>::operator==(left,*right), bVar1)) {
    this->error_ = true;
    PrintErrorMessage<Qentem::String<char>,char[3]>(this,true,left,right,line);
  }
  return;
}

Assistant:

QENTEM_NOINLINE void IsNotEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left == right)) {
            error_ = true;
            QTest::PrintErrorMessage(true, left, right, line);
        }
    }